

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

FunctionPortSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::FunctionPortSyntax,slang::syntax::FunctionPortSyntax_const&>
          (BumpAllocator *this,FunctionPortSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  undefined4 uVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  FunctionPortSyntax *pFVar7;
  long lVar8;
  Token *pTVar9;
  Token *pTVar10;
  byte bVar11;
  
  bVar11 = 0;
  pFVar7 = (FunctionPortSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((FunctionPortSyntax *)this->endPtr < pFVar7 + 1) {
    pFVar7 = (FunctionPortSyntax *)allocateSlow(this,0xa0,8);
  }
  else {
    this->head->current = (byte *)(pFVar7 + 1);
  }
  (pFVar7->super_FunctionPortBaseSyntax).super_SyntaxNode.previewNode =
       (args->super_FunctionPortBaseSyntax).super_SyntaxNode.previewNode;
  uVar3 = *(undefined4 *)&(args->super_FunctionPortBaseSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_FunctionPortBaseSyntax).super_SyntaxNode.parent;
  (pFVar7->super_FunctionPortBaseSyntax).super_SyntaxNode.kind =
       (args->super_FunctionPortBaseSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pFVar7->super_FunctionPortBaseSyntax).super_SyntaxNode.field_0x4 = uVar3;
  (pFVar7->super_FunctionPortBaseSyntax).super_SyntaxNode.parent = pSVar1;
  uVar3 = *(undefined4 *)&(args->attributes).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->attributes).super_SyntaxListBase.super_SyntaxNode.parent;
  (pFVar7->attributes).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->attributes).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pFVar7->attributes).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (pFVar7->attributes).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pFVar7->attributes).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->attributes).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pFVar7->attributes).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_0062ede0;
  (pFVar7->attributes).super_SyntaxListBase.childCount =
       (args->attributes).super_SyntaxListBase.childCount;
  sVar2 = (args->attributes).
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pFVar7->attributes).super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
  _M_ptr = (args->attributes).
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pFVar7->attributes).super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
  _M_extent._M_extent_value = sVar2;
  (pFVar7->attributes).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_0062f0b8;
  pTVar9 = &args->constKeyword;
  pTVar10 = &pFVar7->constKeyword;
  for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
    uVar4 = pTVar9->field_0x2;
    NVar5.raw = (pTVar9->numFlags).raw;
    uVar6 = pTVar9->rawLen;
    pTVar10->kind = pTVar9->kind;
    pTVar10->field_0x2 = uVar4;
    pTVar10->numFlags = (NumericTokenFlags)NVar5.raw;
    pTVar10->rawLen = uVar6;
    pTVar9 = (Token *)&pTVar9[-(ulong)bVar11].info;
    pTVar10 = (Token *)&pTVar10[-(ulong)bVar11].info;
  }
  return pFVar7;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }